

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall despot::Function::SetValue(Function *this,int pid,int cid,double value)

{
  size_type sVar1;
  reference this_00;
  reference pvVar2;
  reference this_01;
  mapped_type *pmVar3;
  double value_local;
  int cid_local;
  int pid_local;
  Function *this_local;
  
  value_local._0_4_ = cid;
  value_local._4_4_ = pid;
  _cid_local = this;
  sVar1 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&this->values_);
  if (sVar1 == 0) {
    this_01 = std::
              vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
              ::operator[](&this->map_,(long)value_local._4_4_);
    pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](this_01,(key_type_conflict *)&value_local);
    *pmVar3 = value;
  }
  else {
    this_00 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::operator[](&this->values_,(long)value_local._4_4_);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (this_00,(long)value_local._0_4_);
    *pvVar2 = value;
  }
  return;
}

Assistant:

void Function::SetValue(int pid, int cid, double value) {
	if (values_.size() > 0) { // TODO: possible refactoring to use a single data structure
		values_[pid][cid] = value;
	} else {
		map_[pid][cid] = value;
	}
}